

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::AddVarint
          (UnknownFieldLiteParserHelper *this,uint32_t num,uint64_t value)

{
  if (this->unknown_ != (string *)0x0) {
    WriteVarint((ulong)(num << 3),this->unknown_);
    WriteVarint(value,this->unknown_);
    return;
  }
  return;
}

Assistant:

void AddVarint(uint32_t num, uint64_t value) {
    if (unknown_ == nullptr) return;
    WriteVarint(num * 8, unknown_);
    WriteVarint(value, unknown_);
  }